

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_case_skipped(XmlReporter *this,TestCaseData *in)

{
  long in_RDI;
  char *in_stack_00000020;
  string *in_stack_00000028;
  XmlWriter *in_stack_00000030;
  TestCaseData *in_stack_00000208;
  XmlReporter *in_stack_00000210;
  allocator local_31;
  XmlWriter *in_stack_ffffffffffffffd0;
  
  if ((*(byte *)(*(long *)(in_RDI + 0x78) + 0x84) & 1) == 0) {
    test_case_start_impl(in_stack_00000210,in_stack_00000208);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,"skipped",&local_31);
    XmlWriter::writeAttribute(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    XmlWriter::endElement(in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void test_case_skipped(const TestCaseData& in) override {
            if(opt.no_skipped_summary == false) {
                test_case_start_impl(in);
                xml.writeAttribute("skipped", "true");
                xml.endElement();
            }
        }